

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Benchmark::Benchmark::run<std::chrono::_V2::steady_clock>(Benchmark *this)

{
  Environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> EVar1;
  int iVar2;
  IMutableContext *pIVar3;
  undefined4 extraout_var;
  IResultCapture *pIVar4;
  anon_class_24_3_fd67980c *fun;
  anon_class_24_3_b965e527 *fun_00;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
  in_R8;
  IConfigPtr cfg;
  CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7339:46)>_>
  samples;
  BenchmarkInfo info;
  Environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> env;
  SampleAnalysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> analysis;
  BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> stats;
  Detail *local_240;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_238 [2];
  _Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  local_228;
  BenchmarkInfo local_210;
  CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7323:43)>_>
  local_1c8;
  double local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  double local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  SampleAnalysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> local_160;
  BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> local_e8;
  
  pIVar3 = getCurrentMutableContext();
  iVar2 = (*(pIVar3->super_IContext)._vptr_IContext[4])(pIVar3);
  std::__shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2> *)&local_240,
             (__shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(extraout_var,iVar2));
  Detail::measure_environment<std::chrono::_V2::steady_clock>();
  pIVar4 = getResultCapture();
  (*pIVar4->_vptr_IResultCapture[6])(pIVar4,&this->name);
  local_e8.info.name._M_dataplus._M_p = (pointer)&local_240;
  local_e8.info.name._M_string_length = (size_type)&local_1a0;
  local_e8.info.name.field_2._M_allocated_capacity = (size_type)this;
  user_code<Catch::Benchmark::Benchmark::run<std::chrono::_V2::steady_clock>()::_lambda()_1_>
            (&local_1c8,(Benchmark *)&local_e8,fun);
  std::__cxx11::string::string((string *)&local_210,(string *)&this->name);
  local_210.estimatedDuration = local_1c8.estimated_duration.__r;
  local_210.iterations = local_1c8.iterations_per_sample;
  local_210.samples = (**(code **)(*(long *)local_240 + 0xb0))();
  local_210.resamples = (**(code **)(*(long *)local_240 + 0xc0))();
  local_210.clockResolution = local_1a0;
  local_210.clockCost = local_180;
  pIVar4 = getResultCapture();
  (*pIVar4->_vptr_IResultCapture[7])(pIVar4,&local_210);
  local_e8.info.name._M_dataplus._M_p = (pointer)&local_1c8;
  local_e8.info.name._M_string_length = (size_type)&local_240;
  local_e8.info.name.field_2._M_allocated_capacity = (size_type)&local_1a0;
  user_code<Catch::Benchmark::Benchmark::run<std::chrono::_V2::steady_clock>()::_lambda()_2_>
            ((CompleteType_t<FunctionReturnType<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_submodules_catch2_catch_hpp:7339:46)>_>
              *)&local_228,(Benchmark *)&local_e8,fun_00);
  EVar1.clock_resolution.outliers.samples_seen = (undefined4)uStack_198;
  EVar1.clock_resolution.outliers.low_severe = uStack_198._4_4_;
  EVar1.clock_resolution.mean.__r = local_1a0;
  EVar1.clock_resolution.outliers.low_mild = (undefined4)local_190;
  EVar1.clock_resolution.outliers.high_mild = local_190._4_4_;
  EVar1.clock_resolution._24_8_ = uStack_188;
  EVar1.clock_cost.mean.__r = local_180;
  EVar1.clock_cost.outliers.samples_seen = (undefined4)uStack_178;
  EVar1.clock_cost.outliers.low_severe = uStack_178._4_4_;
  EVar1.clock_cost.outliers.low_mild = (undefined4)local_170;
  EVar1.clock_cost.outliers.high_mild = local_170._4_4_;
  EVar1.clock_cost._24_8_ = uStack_168;
  Detail::
  analyse<std::chrono::duration<double,std::ratio<1l,1000000000l>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>>
            (&local_160,local_240,(IConfig *)local_228._M_impl.super__Vector_impl_data._M_start,
             EVar1,(__normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
                    )local_228._M_impl.super__Vector_impl_data._M_finish,in_R8);
  BenchmarkInfo::BenchmarkInfo(&local_e8.info,&local_210);
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  ::vector(&local_e8.samples,&local_160.samples);
  local_e8.mean.upper_bound.__r = local_160.mean.upper_bound.__r;
  local_e8.mean.confidence_interval = local_160.mean.confidence_interval;
  local_e8.mean.point.__r = local_160.mean.point.__r;
  local_e8.mean.lower_bound.__r = local_160.mean.lower_bound.__r;
  local_e8.standardDeviation.point.__r = local_160.standard_deviation.point.__r;
  local_e8.standardDeviation.lower_bound.__r = local_160.standard_deviation.lower_bound.__r;
  local_e8.standardDeviation.upper_bound.__r = local_160.standard_deviation.upper_bound.__r;
  local_e8.standardDeviation.confidence_interval = local_160.standard_deviation.confidence_interval;
  local_e8.outliers.samples_seen = local_160.outliers.samples_seen;
  local_e8.outliers.low_severe = local_160.outliers.low_severe;
  local_e8.outliers.low_mild = local_160.outliers.low_mild;
  local_e8.outliers.high_mild = local_160.outliers.high_mild;
  local_e8.outliers.high_severe = local_160.outliers.high_severe;
  local_e8.outlierVariance = local_160.outlier_variance;
  pIVar4 = getResultCapture();
  (*pIVar4->_vptr_IResultCapture[8])(pIVar4,&local_e8);
  BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>::~BenchmarkStats
            (&local_e8);
  std::
  _Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  ::~_Vector_base((_Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                   *)&local_160);
  std::
  _Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  ::~_Vector_base(&local_228);
  std::__cxx11::string::~string((string *)&local_210);
  if ((__uniq_ptr_impl<Catch::Benchmark::Detail::BenchmarkFunction::callable,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
       )local_1c8.benchmark.f._M_t.
        super___uniq_ptr_impl<Catch::Benchmark::Detail::BenchmarkFunction::callable,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
        ._M_t.
        super__Tuple_impl<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
        .super__Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false>.
        _M_head_impl !=
      (__uniq_ptr_impl<Catch::Benchmark::Detail::BenchmarkFunction::callable,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
       )0x0) {
    (*(*(_func_int ***)
        local_1c8.benchmark.f._M_t.
        super___uniq_ptr_impl<Catch::Benchmark::Detail::BenchmarkFunction::callable,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
        ._M_t.
        super__Tuple_impl<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_std::default_delete<Catch::Benchmark::Detail::BenchmarkFunction::callable>_>
        .super__Head_base<0UL,_Catch::Benchmark::Detail::BenchmarkFunction::callable_*,_false>.
        _M_head_impl)[3])();
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_238);
  return;
}

Assistant:

void run() {
                IConfigPtr cfg = getCurrentContext().getConfig();

                auto env = Detail::measure_environment<Clock>();

                getResultCapture().benchmarkPreparing(name);
                CATCH_TRY{
                    auto plan = user_code([&] {
                        return prepare<Clock>(*cfg, env);
                    });

                    BenchmarkInfo info {
                        name,
                        plan.estimated_duration.count(),
                        plan.iterations_per_sample,
                        cfg->benchmarkSamples(),
                        cfg->benchmarkResamples(),
                        env.clock_resolution.mean.count(),
                        env.clock_cost.mean.count()
                    };

                    getResultCapture().benchmarkStarting(info);

                    auto samples = user_code([&] {
                        return plan.template run<Clock>(*cfg, env);
                    });

                    auto analysis = Detail::analyse(*cfg, env, samples.begin(), samples.end());
                    BenchmarkStats<FloatDuration<Clock>> stats{ info, analysis.samples, analysis.mean, analysis.standard_deviation, analysis.outliers, analysis.outlier_variance };
                    getResultCapture().benchmarkEnded(stats);

                }